

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

OneOf<kj::CompressionParameters,_kj::Exception> * __thiscall
kj::_::tryParseExtensionAgreement
          (OneOf<kj::CompressionParameters,_kj::Exception> *__return_storage_ptr__,_ *this,
          Maybe<kj::CompressionParameters> *clientOffer,StringPtr agreedParameters)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  Exception *pEVar4;
  ArrayPtr<const_char> *pAVar5;
  char (*params_1) [84];
  NullableValue<kj::CompressionParameters> *other;
  CompressionParameters *pCVar6;
  CompressionParameters **ppCVar7;
  unsigned_long **ppuVar8;
  char (*params_1_00) [62];
  StringPtr *params_1_01;
  char delim;
  String *pSVar9;
  ArrayPtr<const_char> AVar10;
  ArrayPtr<const_char> input;
  String local_3b0;
  char (*local_398) [84];
  Fault local_390;
  unsigned_long *local_388;
  unsigned_long *_kj_result_1;
  unsigned_long *value;
  unsigned_long *_value5294;
  CompressionParameters *local_368;
  Fault local_360;
  CompressionParameters *local_358;
  CompressionParameters *_kj_result;
  CompressionParameters *client;
  CompressionParameters *config;
  undefined1 local_310 [8];
  NullableValue<kj::CompressionParameters> _config5288;
  ArrayPtr<const_char> local_2c8;
  ArrayPtr<const_char> local_2b8;
  _ *local_2a8;
  char *pcStack_2a0;
  undefined1 local_290 [8];
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  undefined1 auStack_258 [8];
  StringPtr EXPECT;
  undefined1 local_238 [8];
  Vector<kj::ArrayPtr<const_char>_> offers;
  String local_210 [2];
  String local_1e0;
  undefined1 local_1c8 [8];
  Exception e;
  StringPtr FAILURE;
  Maybe<kj::CompressionParameters> *clientOffer_local;
  StringPtr agreedParameters_local;
  
  agreedParameters_local.content.ptr = agreedParameters.content.ptr;
  e.details.builder.disposer = (ArrayDisposer *)anon_var_dwarf_843772;
  clientOffer_local = clientOffer;
  agreedParameters_local.content.size_ = (size_t)__return_storage_ptr__;
  Debug::makeDescription<>(&local_1e0,"");
  params_1_00 = (char (*) [62])0x148f;
  pSVar9 = &local_1e0;
  Exception::Exception
            ((Exception *)local_1c8,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x148f,&local_1e0);
  delim = (char)pSVar9;
  String::~String(&local_1e0);
  bVar2 = Maybe<kj::CompressionParameters>::operator==((Maybe<kj::CompressionParameters> *)this);
  if (bVar2) {
    str<kj::StringPtr_const&,char_const(&)[62]>
              (local_210,(kj *)&e.details.builder.disposer,
               (StringPtr *)"added Sec-WebSocket-Extensions when client did not offer any.",
               params_1_00);
    Exception::setDescription((Exception *)local_1c8,local_210);
    String::~String(local_210);
    pEVar4 = mv<kj::Exception>((Exception *)local_1c8);
    OneOf<kj::CompressionParameters,kj::Exception>::OneOf<kj::Exception,int>
              ((OneOf<kj::CompressionParameters,kj::Exception> *)__return_storage_ptr__,pEVar4);
    offers.builder.disposer._4_4_ = 1;
  }
  else {
    AVar10 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&clientOffer_local);
    input.ptr = (char *)AVar10.size_;
    EXPECT.content.size_ = (size_t)AVar10.ptr;
    input.size_ = 0x2c;
    params_1_01 = (StringPtr *)0x2c;
    splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_238,(_ *)EXPECT.content.size_,input,delim)
    ;
    sVar3 = Vector<kj::ArrayPtr<const_char>_>::size((Vector<kj::ArrayPtr<const_char>_> *)local_238);
    if (sVar3 == 1) {
      pAVar5 = Vector<kj::ArrayPtr<const_char>_>::front
                         ((Vector<kj::ArrayPtr<const_char>_> *)local_238);
      local_2a8 = (_ *)pAVar5->ptr;
      pcStack_2a0 = (char *)pAVar5->size_;
      AVar10.size_ = 0x3b;
      AVar10.ptr = pcStack_2a0;
      splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_290,local_2a8,AVar10,delim);
      pAVar5 = Vector<kj::ArrayPtr<const_char>_>::front
                         ((Vector<kj::ArrayPtr<const_char>_> *)local_290);
      local_2c8 = (ArrayPtr<const_char>)operator____kj("permessage-deflate",0x12);
      AVar10 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_2c8);
      local_2b8.size_ = AVar10.size_;
      params_1 = (char (*) [84])AVar10.ptr;
      local_2b8.ptr = (char *)params_1;
      bVar2 = ArrayPtr<const_char>::operator==(pAVar5,&local_2b8);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        tryExtractParameters
                  ((Maybe<kj::CompressionParameters> *)&config,
                   (Vector<kj::ArrayPtr<const_char>_> *)local_290,true);
        other = readMaybe<kj::CompressionParameters>((Maybe<kj::CompressionParameters> *)&config);
        NullableValue<kj::CompressionParameters>::NullableValue
                  ((NullableValue<kj::CompressionParameters> *)local_310,other);
        Maybe<kj::CompressionParameters>::~Maybe((Maybe<kj::CompressionParameters> *)&config);
        pCVar6 = NullableValue::operator_cast_to_CompressionParameters_((NullableValue *)local_310);
        if (pCVar6 == (CompressionParameters *)0x0) {
          offers.builder.disposer._4_4_ = 0;
        }
        else {
          client = NullableValue<kj::CompressionParameters>::operator*
                             ((NullableValue<kj::CompressionParameters> *)local_310);
          local_358 = readMaybe<kj::CompressionParameters>((Maybe<kj::CompressionParameters> *)this)
          ;
          if (local_358 == (CompressionParameters *)0x0) {
            Debug::Fault::Fault(&local_360,
                                "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                                ,0x14a9,FAILED,"clientOffer != nullptr","");
            Debug::Fault::fatal(&local_360);
          }
          ppCVar7 = mv<kj::CompressionParameters_const*>(&local_358);
          local_368 = *ppCVar7;
          _kj_result = local_368;
          bVar2 = Maybe<unsigned_long>::operator==(&client->outboundMaxWindowBits);
          if (bVar2) {
            Maybe<unsigned_long>::operator=
                      (&client->outboundMaxWindowBits,&_kj_result->outboundMaxWindowBits);
          }
          else {
            value = readMaybe<unsigned_long>(&_kj_result->outboundMaxWindowBits);
            if (value != (unsigned_long *)0x0) {
              uVar1 = *value;
              _kj_result_1 = value;
              local_388 = readMaybe<unsigned_long>(&client->outboundMaxWindowBits);
              if (local_388 == (unsigned_long *)0x0) {
                Debug::Fault::Fault(&local_390,
                                    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                                    ,0x14af,FAILED,"config.outboundMaxWindowBits != nullptr","");
                Debug::Fault::fatal(&local_390);
              }
              ppuVar8 = mv<unsigned_long*>(&local_388);
              params_1 = (char (*) [84])*ppuVar8;
              local_398 = params_1;
              if (uVar1 < *(ulong *)*params_1) {
                Maybe<unsigned_long>::operator=(&client->outboundMaxWindowBits,_kj_result_1);
              }
            }
          }
          if ((client->outboundNoContextTakeover & 1U) == 0) {
            params_1 = (char (*) [84])
                       (CONCAT71((int7)((ulong)params_1 >> 8),_kj_result->outboundNoContextTakeover)
                       & 0xffffffffffffff01);
            client->outboundNoContextTakeover = SUB81(params_1,0);
          }
          pCVar6 = mv<kj::CompressionParameters>(client);
          OneOf<kj::CompressionParameters,kj::Exception>::OneOf<kj::CompressionParameters,int>
                    ((OneOf<kj::CompressionParameters,kj::Exception> *)__return_storage_ptr__,pCVar6
                    );
          offers.builder.disposer._4_4_ = 1;
        }
        NullableValue<kj::CompressionParameters>::~NullableValue
                  ((NullableValue<kj::CompressionParameters> *)local_310);
        if (offers.builder.disposer._4_4_ == 0) {
          str<kj::StringPtr_const&,char_const(&)[79]>
                    (&local_3b0,(kj *)&e.details.builder.disposer,
                     (StringPtr *)
                     "the Sec-WebSocket-Extensions header in the Response included an invalid value."
                     ,(char (*) [79])params_1);
          Exception::setDescription((Exception *)local_1c8,&local_3b0);
          String::~String(&local_3b0);
          pEVar4 = mv<kj::Exception>((Exception *)local_1c8);
          OneOf<kj::CompressionParameters,kj::Exception>::OneOf<kj::Exception,int>
                    ((OneOf<kj::CompressionParameters,kj::Exception> *)__return_storage_ptr__,pEVar4
                    );
          offers.builder.disposer._4_4_ = 1;
        }
      }
      else {
        str<kj::StringPtr_const&,char_const(&)[84]>
                  ((String *)&_config5288.field_1.value.inboundMaxWindowBits.ptr.field_1,
                   (kj *)&e.details.builder.disposer,
                   (StringPtr *)
                   "response included a Sec-WebSocket-Extensions value that was not permessage-deflate."
                   ,params_1);
        Exception::setDescription
                  ((Exception *)local_1c8,
                   (String *)&_config5288.field_1.value.inboundMaxWindowBits.ptr.field_1);
        String::~String((String *)&_config5288.field_1.value.inboundMaxWindowBits.ptr.field_1);
        pEVar4 = mv<kj::Exception>((Exception *)local_1c8);
        OneOf<kj::CompressionParameters,kj::Exception>::OneOf<kj::Exception,int>
                  ((OneOf<kj::CompressionParameters,kj::Exception> *)__return_storage_ptr__,pEVar4);
        offers.builder.disposer._4_4_ = 1;
      }
      Vector<kj::ArrayPtr<const_char>_>::~Vector((Vector<kj::ArrayPtr<const_char>_> *)local_290);
    }
    else {
      auStack_258 = (undefined1  [8])0xa6d45c;
      EXPECT.content.ptr = (char *)0x50;
      str<kj::StringPtr_const&,kj::StringPtr_const&>
                ((String *)&splitOffer.builder.disposer,(kj *)&e.details.builder.disposer,
                 (StringPtr *)auStack_258,params_1_01);
      Exception::setDescription((Exception *)local_1c8,(String *)&splitOffer.builder.disposer);
      String::~String((String *)&splitOffer.builder.disposer);
      pEVar4 = mv<kj::Exception>((Exception *)local_1c8);
      OneOf<kj::CompressionParameters,kj::Exception>::OneOf<kj::Exception,int>
                ((OneOf<kj::CompressionParameters,kj::Exception> *)__return_storage_ptr__,pEVar4);
      offers.builder.disposer._4_4_ = 1;
    }
    Vector<kj::ArrayPtr<const_char>_>::~Vector((Vector<kj::ArrayPtr<const_char>_> *)local_238);
  }
  Exception::~Exception((Exception *)local_1c8);
  return __return_storage_ptr__;
}

Assistant:

kj::OneOf<CompressionParameters, kj::Exception> tryParseExtensionAgreement(
    const Maybe<CompressionParameters>& clientOffer,
    StringPtr agreedParameters) {
  // Like `tryParseExtensionOffers`, but called by the client when parsing the server's Response.
  // If the client must decline the agreement, we want to provide some details about what went wrong
  // (since the client has to fail the connection).
  constexpr auto FAILURE = "Server failed WebSocket handshake: "_kj;
  auto e = KJ_EXCEPTION(FAILED);

  if (clientOffer == kj::none) {
    // We've received extensions when we did not send any in the first place.
    e.setDescription(
        kj::str(FAILURE, "added Sec-WebSocket-Extensions when client did not offer any."));
    return kj::mv(e);
  }

  auto offers = splitParts(agreedParameters, ',');
  if (offers.size() != 1) {
    constexpr auto EXPECT = "expected exactly one extension (permessage-deflate) but received "
                            "more than one."_kj;
    e.setDescription(kj::str(FAILURE, EXPECT));
    return kj::mv(e);
  }
  auto splitOffer = splitParts(offers.front(), ';');

  if (splitOffer.front() != "permessage-deflate"_kj) {
    e.setDescription(kj::str(FAILURE, "response included a Sec-WebSocket-Extensions value that was "
                                      "not permessage-deflate."));
    return kj::mv(e);
  }

  // Verify the parameters of our single extension, and compare it with the clients original offer.
  KJ_IF_SOME(config, tryExtractParameters(splitOffer, true)) {
    const auto& client = KJ_ASSERT_NONNULL(clientOffer);
    // The server might have ignored the client's hints regarding its compressor's configuration.
    // That's fine, but as the client, we still want to use those outbound compression parameters.
    if (config.outboundMaxWindowBits == kj::none) {
      config.outboundMaxWindowBits = client.outboundMaxWindowBits;
    } else KJ_IF_SOME(value, client.outboundMaxWindowBits) {
      if (value < KJ_ASSERT_NONNULL(config.outboundMaxWindowBits)) {
        // If the client asked for a value smaller than what the server responded with, use the
        // value that the client originally specified.
        config.outboundMaxWindowBits = value;
      }
    }
    if (config.outboundNoContextTakeover == false) {
      config.outboundNoContextTakeover = client.outboundNoContextTakeover;
    }
    return kj::mv(config);
  }

  // There was a problem parsing the server's `Sec-WebSocket-Extensions` response.
  e.setDescription(kj::str(FAILURE, "the Sec-WebSocket-Extensions header in the Response included "
      "an invalid value."));
  return kj::mv(e);
}